

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

int Curl_pp_getsock(Curl_easy *data,pingpong *pp,curl_socket_t *socks)

{
  connectdata *conn;
  curl_socket_t *socks_local;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  *socks = data->conn->sock[0];
  if (pp->sendleft == 0) {
    data_local._4_4_ = 1;
  }
  else {
    data_local._4_4_ = 0x10000;
  }
  return data_local._4_4_;
}

Assistant:

int Curl_pp_getsock(struct Curl_easy *data,
                    struct pingpong *pp, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  socks[0] = conn->sock[FIRSTSOCKET];

  if(pp->sendleft) {
    /* write mode */
    return GETSOCK_WRITESOCK(0);
  }

  /* read mode */
  return GETSOCK_READSOCK(0);
}